

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O2

Result __thiscall
presolve::HPresolve::removeDoubletonEquations(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  int row;
  Result RVar1;
  _Base_ptr p_Var2;
  
  p_Var2 = (this->equations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 == &(this->equations)._M_t._M_impl.super__Rb_tree_header) {
      return kOk;
    }
    row = *(int *)&p_Var2[1].field_0x4;
    if (2 < (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[row]) break;
    RVar1 = rowPresolve(this,postsolve_stack,row);
    if (RVar1 != kOk) {
      return RVar1;
    }
    if ((this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
        .super__Vector_impl_data._M_start[row] == '\0') {
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    }
    else {
      p_Var2 = (this->equations)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    }
  }
  return kOk;
}

Assistant:

HPresolve::Result HPresolve::removeDoubletonEquations(
    HighsPostsolveStack& postsolve_stack) {
  auto eq = equations.begin();
  while (eq != equations.end()) {
    HighsInt eqrow = eq->second;
    assert(!rowDeleted[eqrow]);
    assert(eq->first == rowsize[eqrow]);
    assert(model->row_lower_[eqrow] == model->row_upper_[eqrow]);
    if (rowsize[eqrow] > 2) return Result::kOk;
    HPRESOLVE_CHECKED_CALL(rowPresolve(postsolve_stack, eqrow));
    if (rowDeleted[eqrow])
      eq = equations.begin();
    else
      ++eq;
  }

  return Result::kOk;
}